

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_LZWDecoder.cc
# Opt level: O0

void __thiscall Pl_LZWDecoder::sendNextCode(Pl_LZWDecoder *this)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint local_38;
  uint code;
  uint low_mask;
  uint med_mask;
  uint high_mask;
  uint bits_from_low;
  uint bits_from_med;
  uint bits_from_high;
  uint low;
  uint med;
  uint high;
  Pl_LZWDecoder *this_local;
  
  uVar4 = (this->byte_pos + 1) % 3;
  uVar5 = (this->byte_pos + 2) % 3;
  iVar3 = 8 - this->bit_pos;
  high_mask = this->code_size - iVar3;
  med_mask = 0;
  if (8 < high_mask) {
    med_mask = high_mask - 8;
    high_mask = 8;
  }
  bVar1 = (byte)high_mask;
  bVar2 = (byte)med_mask;
  local_38 = (((uint)this->buf[uVar4] & 0xffU - ((1 << (8 - bVar1 & 0x1f)) + -1)) >>
             (8 - bVar1 & 0x1f)) +
             (((uint)this->buf[this->byte_pos] & (1 << ((byte)iVar3 & 0x1f)) - 1U) << (bVar1 & 0x1f)
             );
  if (med_mask == 0) {
    this->byte_pos = uVar4;
    this->bit_pos = high_mask;
  }
  else {
    local_38 = (((uint)this->buf[uVar5] & 0xffU - ((1 << (8 - bVar2 & 0x1f)) + -1)) >>
               (8 - bVar2 & 0x1f)) + (local_38 << (bVar2 & 0x1f));
    this->byte_pos = uVar5;
    this->bit_pos = med_mask;
  }
  if (this->bit_pos == 8) {
    this->bit_pos = 0;
    this->byte_pos = this->byte_pos + 1;
    this->byte_pos = this->byte_pos % 3;
  }
  this->bits_available = this->bits_available - this->code_size;
  handleCode(this,local_38);
  return;
}

Assistant:

void
Pl_LZWDecoder::sendNextCode()
{
    unsigned int high = this->byte_pos;
    unsigned int med = (this->byte_pos + 1) % 3;
    unsigned int low = (this->byte_pos + 2) % 3;

    unsigned int bits_from_high = 8 - this->bit_pos;
    unsigned int bits_from_med = this->code_size - bits_from_high;
    unsigned int bits_from_low = 0;
    if (bits_from_med > 8) {
        bits_from_low = bits_from_med - 8;
        bits_from_med = 8;
    }
    unsigned int high_mask = (1U << bits_from_high) - 1U;
    unsigned int med_mask = 0xff - ((1U << (8 - bits_from_med)) - 1U);
    unsigned int low_mask = 0xff - ((1U << (8 - bits_from_low)) - 1U);
    unsigned int code = 0;
    code += (this->buf[high] & high_mask) << bits_from_med;
    code += ((this->buf[med] & med_mask) >> (8 - bits_from_med));
    if (bits_from_low) {
        code <<= bits_from_low;
        code += ((this->buf[low] & low_mask) >> (8 - bits_from_low));
        this->byte_pos = low;
        this->bit_pos = bits_from_low;
    } else {
        this->byte_pos = med;
        this->bit_pos = bits_from_med;
    }
    if (this->bit_pos == 8) {
        this->bit_pos = 0;
        ++this->byte_pos;
        this->byte_pos %= 3;
    }
    this->bits_available -= this->code_size;

    handleCode(code);
}